

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

Rect __thiscall
SkylineBinPack::FindPositionForNewNodeMinWaste
          (SkylineBinPack *this,int width,int height,int *bestHeight,int *bestWastedArea,
          int *bestIndex)

{
  Rect RVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  SkylineNode *pSVar5;
  int local_4c;
  int local_48;
  int wastedArea;
  int y;
  uint i;
  int *bestIndex_local;
  int *bestWastedArea_local;
  int *bestHeight_local;
  int height_local;
  int width_local;
  SkylineBinPack *this_local;
  Rect newNode;
  
  *bestHeight = 0x7fffffff;
  *bestWastedArea = 0x7fffffff;
  *bestIndex = -1;
  _y = bestIndex;
  bestIndex_local = bestWastedArea;
  bestWastedArea_local = bestHeight;
  bestHeight_local._0_4_ = height;
  bestHeight_local._4_4_ = width;
  _height_local = this;
  memset(&this_local,0,0x10);
  wastedArea = 0;
  do {
    iVar2 = wastedArea;
    uVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Size(&this->skyLine);
    if (uVar4 <= (uint)iVar2) {
      RVar1.y = this_local._4_4_;
      RVar1.x = (int)this_local;
      RVar1.width = newNode.x;
      RVar1.height = newNode.y;
      return RVar1;
    }
    bVar3 = RectangleFits(this,wastedArea,bestHeight_local._4_4_,(int)bestHeight_local,&local_48,
                          &local_4c);
    if ((bVar3) &&
       ((local_4c < *bestIndex_local ||
        ((local_4c == *bestIndex_local && (local_48 + (int)bestHeight_local < *bestWastedArea_local)
         ))))) {
      *bestWastedArea_local = local_48 + (int)bestHeight_local;
      *bestIndex_local = local_4c;
      *_y = wastedArea;
      pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                         (&this->skyLine,(ulong)(uint)wastedArea);
      this_local._0_4_ = pSVar5->x;
      this_local._4_4_ = local_48;
      newNode.x = bestHeight_local._4_4_;
      newNode.y = (int)bestHeight_local;
      bVar3 = DisjointRectCollection::Disjoint(&this->disjointRects,(Rect *)&this_local);
      if (!bVar3) {
        __assert_fail("disjointRects.Disjoint(newNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0x181,
                      "Rect SkylineBinPack::FindPositionForNewNodeMinWaste(int, int, int &, int &, int &) const"
                     );
      }
    }
    wastedArea = wastedArea + 1;
  } while( true );
}

Assistant:

Rect SkylineBinPack::FindPositionForNewNodeMinWaste(int width, int height, int &bestHeight, int &bestWastedArea, int &bestIndex) const
{
	bestHeight = INT_MAX;
	bestWastedArea = INT_MAX;
	bestIndex = -1;
	Rect newNode;
	memset(&newNode, 0, sizeof(newNode));
	for(unsigned i = 0; i < skyLine.Size(); ++i)
	{
		int y;
		int wastedArea;

		if (RectangleFits(i, width, height, y, wastedArea))
		{
			if (wastedArea < bestWastedArea || (wastedArea == bestWastedArea && y + height < bestHeight))
			{
				bestHeight = y + height;
				bestWastedArea = wastedArea;
				bestIndex = i;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = width;
				newNode.height = height;
#ifdef _DEBUG
				assert(disjointRects.Disjoint(newNode));
#endif
			}
		}
/*		if (RectangleFits(i, height, width, y, wastedArea))
		{
			if (wastedArea < bestWastedArea || (wastedArea == bestWastedArea && y + width < bestHeight))
			{
				bestHeight = y + width;
				bestWastedArea = wastedArea;
				bestIndex = i;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = height;
				newNode.height = width;
				assert(disjointRects.Disjoint(newNode));
			}
		}*/
	}

	return newNode;
}